

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void nukedopll_update(void *chipptr,UINT32 samples,DEV_SMPL **out)

{
  uint local_34;
  DEV_SMPL local_30;
  UINT32 i;
  int32_t buffer [2];
  opll_t *chip;
  DEV_SMPL **out_local;
  UINT32 samples_local;
  void *chipptr_local;
  
  buffer = (int32_t  [2])chipptr;
  for (local_34 = 0; local_34 < samples; local_34 = local_34 + 1) {
    OPLL_GenerateResampled((opll_t *)buffer,&local_30);
    (*out)[local_34] = local_30;
    out[1][local_34] = i;
  }
  return;
}

Assistant:

static void nukedopll_update(void *chipptr, UINT32 samples, DEV_SMPL **out)
{
	opll_t *chip = (opll_t *)chipptr;
	int32_t buffer[2];
	UINT32 i;
	
	for (i = 0; i < samples; i ++)
	{
		OPLL_GenerateResampled(chip, buffer);
		out[0][i] = buffer[0];
		out[1][i] = buffer[1];
	}
	
	return;
}